

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::CanonicalizePath_abi_cxx11_
          (string *__return_storage_ptr__,compiler *this,string_view path)

{
  undefined8 uVar1;
  string *psVar2;
  size_t sVar3;
  int iVar4;
  char *pcVar5;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  canonical_parts;
  const_iterator __begin2;
  string_view part;
  strings_internal *local_c8;
  iterator iStack_c0;
  basic_string_view<char,_std::char_traits<char>_> *local_b8;
  undefined1 local_a8 [16];
  size_t local_98;
  char *pcStack_90;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_88;
  DelimiterType local_80;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  char *local_60;
  compiler *local_58;
  string *local_50;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_48;
  
  pcVar5 = (char *)path._M_len;
  local_c8 = (strings_internal *)0x0;
  iStack_c0._M_current = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  local_b8 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  if ((this != (compiler *)0x0) && (*pcVar5 == '/')) {
    local_a8._0_8_ = 0;
    local_a8._8_8_ = "";
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)&local_c8,(iterator)0x0,
               (basic_string_view<char,_std::char_traits<char>_> *)local_a8);
  }
  uVar1 = local_a8._8_8_;
  local_88 = &local_48;
  local_48.delimiter_.c_ = '/';
  local_a8._0_8_ = (compiler *)0x0;
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffff00000000;
  local_98 = 0;
  pcStack_90 = (char *)0x0;
  local_80.c_ = '/';
  local_60 = pcVar5;
  local_58 = this;
  local_50 = __return_storage_ptr__;
  local_48.text_._M_len = (size_t)this;
  local_48.text_._M_str = pcVar5;
  if (pcVar5 == (char *)0x0) {
    local_a8._12_4_ = SUB84(uVar1,4);
    local_a8._8_4_ = 2;
    local_a8._0_8_ = this;
  }
  else {
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)local_a8);
  }
  sVar3 = local_48.text_._M_len;
  while ((psVar2 = local_50, local_a8._8_4_ != kEndState || (local_a8._0_8_ != sVar3))) {
    local_78._M_len = local_98;
    local_78._M_str = pcStack_90;
    if ((local_98 != 1) || (iVar4 = bcmp(pcStack_90,".",1), iVar4 != 0)) {
      if (iStack_c0._M_current == local_b8) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)&local_c8,iStack_c0,&local_78);
      }
      else {
        (iStack_c0._M_current)->_M_len = local_98;
        (iStack_c0._M_current)->_M_str = pcStack_90;
        iStack_c0._M_current = iStack_c0._M_current + 1;
      }
    }
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)local_a8);
  }
  if ((local_58 != (compiler *)0x0) && ((local_60 + -1)[(long)local_58] == '/')) {
    local_a8._0_8_ = (compiler *)0x0;
    local_a8._8_8_ = "";
    if (iStack_c0._M_current == local_b8) {
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)&local_c8,iStack_c0,(basic_string_view<char,_std::char_traits<char>_> *)local_a8
                );
    }
    else {
      (iStack_c0._M_current)->_M_len = 0;
      (iStack_c0._M_current)->_M_str = "";
      iStack_c0._M_current = iStack_c0._M_current + 1;
    }
  }
  absl::lts_20250127::strings_internal::
  JoinAlgorithm<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,void>
            (psVar2,local_c8,iStack_c0._M_current,1,"/");
  if (local_c8 != (strings_internal *)0x0) {
    operator_delete(local_c8,(long)local_b8 - (long)local_c8);
  }
  return psVar2;
}

Assistant:

static std::string CanonicalizePath(absl::string_view path) {
#ifdef _WIN32
  // The Win32 API accepts forward slashes as a path delimiter even though
  // backslashes are standard.  Let's avoid confusion and use only forward
  // slashes.
  std::string path_str;
  if (absl::StartsWith(path, "\\\\")) {
    // Avoid converting two leading backslashes.
    path_str = absl::StrCat("\\\\",
                            absl::StrReplaceAll(path.substr(2), {{"\\", "/"}}));
  } else {
    path_str = absl::StrReplaceAll(path, {{"\\", "/"}});
  }
  path = path_str;
#endif

  std::vector<absl::string_view> canonical_parts;
  if (!path.empty() && path.front() == '/') canonical_parts.push_back("");
  for (absl::string_view part : absl::StrSplit(path, '/', absl::SkipEmpty())) {
    if (part == ".") {
      // Ignore.
    } else {
      canonical_parts.push_back(part);
    }
  }
  if (!path.empty() && path.back() == '/') canonical_parts.push_back("");

  return absl::StrJoin(canonical_parts, "/");
}